

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O0

int64_t __thiscall
BamTools::Internal::BamFtp::WriteDataSocket(BamFtp *this,char *data,uint numBytes)

{
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [8];
  string *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  IBamIODevice *in_stack_ffffffffffffffe0;
  
  bamtools_noop();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"BamFtp::Write",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"write-mode not supported on this device",&local_71);
  IBamIODevice::SetErrorString
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return -1;
}

Assistant:

int64_t BamFtp::WriteDataSocket(const char* data, const unsigned int numBytes)
{
    (void)data;
    (void)numBytes;
    BT_ASSERT_X(false, "BamFtp::WriteDataSocket: write-mode not supported on this device");
    SetErrorString("BamFtp::Write", "write-mode not supported on this device");
    return -1;
}